

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.hpp
# Opt level: O0

void __thiscall QpSolution::QpSolution(QpSolution *this,Instance *instance)

{
  allocator_type *__a;
  size_type __n;
  long in_RSI;
  long in_RDI;
  QpVector *this_00;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *this_01;
  undefined8 in_stack_ffffffffffffffb8;
  HighsInt d;
  QpVector *in_stack_ffffffffffffffc0;
  vector<BasisStatus,_std::allocator<BasisStatus>_> local_1d;
  
  d = (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_1d.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
  super__Vector_impl_data._13_8_ = in_RSI;
  QpVector::QpVector(in_stack_ffffffffffffffc0,d);
  QpVector::QpVector(in_stack_ffffffffffffffc0,d);
  this_00 = (QpVector *)(in_RDI + 0x70);
  QpVector::QpVector(this_00,d);
  QpVector::QpVector(this_00,(HighsInt)((ulong)(in_RDI + 0xa8) >> 0x20));
  __a = (allocator_type *)(in_RDI + 0xe0);
  __n = (size_type)
        *(int *)(local_1d.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                 super__Vector_impl_data._13_8_ + 4);
  this_01 = &local_1d;
  std::allocator<BasisStatus>::allocator((allocator<BasisStatus> *)0x7540f4);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector(this_01,__n,__a);
  std::allocator<BasisStatus>::~allocator((allocator<BasisStatus> *)0x754114);
  std::allocator<BasisStatus>::allocator((allocator<BasisStatus> *)0x754140);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector(this_01,__n,__a);
  std::allocator<BasisStatus>::~allocator((allocator<BasisStatus> *)0x75415f);
  return;
}

Assistant:

QpSolution(Instance& instance)
      : primal(QpVector(instance.num_var)),
        rowactivity(QpVector(instance.num_con)),
        dualvar(instance.num_var),
        dualcon(instance.num_con),
        status_var(instance.num_var),
        status_con(instance.num_con) {}